

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
cs::compiler_type::split_token
          (compiler_type *this,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *raw,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *signals,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *objects)

{
  bool bVar1;
  int iVar2;
  compile_error *this_00;
  token_base **ptr;
  iterator __end1;
  iterator __begin1;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *__range1;
  bool request_signal;
  _Self *in_stack_ffffffffffffff28;
  _Self *in_stack_ffffffffffffff30;
  allocator local_99;
  string local_98 [32];
  reference local_78;
  _Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**> local_50;
  byte local_21;
  
  local_21 = 0;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::begin
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffff28
            );
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::end
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)in_stack_ffffffffffffff28
            );
  while( true ) {
    bVar1 = std::operator!=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if (!bVar1) {
      if ((local_21 & 1) == 0) {
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_ffffffffffffff30,(value_type *)in_stack_ffffffffffffff28);
      }
      return;
    }
    local_78 = std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::
               operator*(&local_50);
    iVar2 = (*(*local_78)->_vptr_token_base[2])();
    if (iVar2 == 2) break;
    iVar2 = (*(*local_78)->_vptr_token_base[2])();
    if (iVar2 == 3) {
      if ((local_21 & 1) == 0) {
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_ffffffffffffff30,(value_type *)in_stack_ffffffffffffff28);
      }
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                 in_stack_ffffffffffffff30,(value_type *)in_stack_ffffffffffffff28);
      local_21 = 0;
    }
    else {
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                 in_stack_ffffffffffffff30,(value_type *)in_stack_ffffffffffffff28);
      local_21 = 1;
    }
    std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::operator++
              (in_stack_ffffffffffffff30);
  }
  this_00 = (compile_error *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"Wrong format of expression.",&local_99);
  compile_error::compile_error(this_00,(string *)in_stack_ffffffffffffff28);
  __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

void compiler_type::split_token(std::deque<token_base *> &raw, std::deque<token_base *> &signals,
	                                std::deque<token_base *> &objects)
	{
		bool request_signal = false;
		for (auto &ptr: raw) {
			if (ptr->get_type() == token_types::action)
				throw compile_error("Wrong format of expression.");
			if (ptr->get_type() == token_types::signal) {
				if (!request_signal)
					objects.push_back(nullptr);
				signals.push_back(ptr);
				request_signal = false;
			}
			else {
				objects.push_back(ptr);
				request_signal = true;
			}
		}
		if (!request_signal)
			objects.push_back(nullptr);
	}